

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall llvm::yaml::Stream::skip(Stream *this)

{
  bool bVar1;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *this_00;
  pointer this_01;
  document_iterator local_20;
  document_iterator e;
  document_iterator i;
  Stream *this_local;
  
  e = begin(this);
  local_20 = end(this);
  while( true ) {
    bVar1 = document_iterator::operator!=(&e,&local_20);
    if (!bVar1) break;
    this_00 = document_iterator::operator->(&e);
    this_01 = std::unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>::
              operator->(this_00);
    Document::skip(this_01);
    document_iterator::operator++(&e);
  }
  return;
}

Assistant:

void Stream::skip() {
  for (document_iterator i = begin(), e = end(); i != e; ++i)
    i->skip();
}